

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O0

void __thiscall
Lib::DArray<unsigned_int>::
sortGen<false,Lib::ClosureComparator<Kernel::PrecedenceOrdering::show(std::ostream&)const::__2>>
          (DArray<unsigned_int> *this,
          ClosureComparator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Ordering_cpp:963:7)>
          comp)

{
  uint uVar1;
  int iVar2;
  Comparison CVar3;
  size_t sVar4;
  uint *puVar5;
  unsigned_long *puVar6;
  DArray<unsigned_int> *in_RDI;
  uint aux_1;
  uint aux;
  size_t r;
  size_t l;
  uint mid;
  size_t m;
  size_t p;
  size_t to;
  size_t from;
  uint in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  ClosureComparator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Ordering_cpp:963:7)>
  *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  uint uVar7;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  uint uVar8;
  undefined4 in_stack_ffffffffffffff7c;
  size_t local_58;
  ulong local_50;
  ulong local_40;
  size_t local_38;
  ulong local_30;
  ulong local_28;
  
  if (1 < in_RDI->_size) {
    if ((sortGen<false,Lib::ClosureComparator<Kernel::PrecedenceOrdering::show(std::ostream&)const::$_2>>(Lib::ClosureComparator<Kernel::PrecedenceOrdering::show(std::ostream&)const::$_2>)
         ::ft == '\0') &&
       (iVar2 = __cxa_guard_acquire(&sortGen<false,Lib::ClosureComparator<Kernel::PrecedenceOrdering::show(std::ostream&)const::$_2>>(Lib::ClosureComparator<Kernel::PrecedenceOrdering::show(std::ostream&)const::$_2>)
                                     ::ft), iVar2 != 0)) {
      DArray<unsigned_long>::DArray
                ((DArray<unsigned_long> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      __cxa_atexit(DArray<unsigned_long>::~DArray,
                   &sortGen<false,_Lib::ClosureComparator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/Ordering.cpp:963:7)>_>
                    ::ft,&__dso_handle);
      __cxa_guard_release(&sortGen<false,Lib::ClosureComparator<Kernel::PrecedenceOrdering::show(std::ostream&)const::$_2>>(Lib::ClosureComparator<Kernel::PrecedenceOrdering::show(std::ostream&)const::$_2>)
                           ::ft);
    }
    local_28 = 0;
    sVar4 = size(in_RDI);
    local_30 = sVar4 - 1;
    DArray<unsigned_long>::ensure
              ((DArray<unsigned_long> *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    local_38 = 0;
    while( true ) {
      do {
        iVar2 = Random::getInteger((int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
        local_40 = local_28 + (long)iVar2;
        puVar5 = operator[](in_RDI,local_40);
        uVar1 = *puVar5;
        local_50 = local_28;
        local_58 = local_30;
        while (local_50 < local_40) {
          operator[](in_RDI,local_50);
          CVar3 = ClosureComparator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/Ordering.cpp:963:7)>
                  ::compare<unsigned_int>
                            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                             in_stack_ffffffffffffff48);
          if ((uint)(CVar3 + GREATER) < 2) {
            local_50 = local_50 + 1;
          }
          else if (CVar3 == GREATER) {
            if (local_40 == local_58) {
              puVar5 = operator[](in_RDI,local_50);
              uVar7 = *puVar5;
              puVar5 = operator[](in_RDI,local_40);
              *puVar5 = uVar7;
              puVar5 = operator[](in_RDI,local_40 - 1);
              uVar7 = *puVar5;
              puVar5 = operator[](in_RDI,local_50);
              *puVar5 = uVar7;
              puVar5 = operator[](in_RDI,local_40 - 1);
              *puVar5 = uVar1;
              local_40 = local_40 - 1;
            }
            else {
              puVar5 = operator[](in_RDI,local_50);
              uVar7 = *puVar5;
              puVar5 = operator[](in_RDI,local_58);
              uVar8 = *puVar5;
              puVar5 = operator[](in_RDI,local_50);
              *puVar5 = uVar8;
              puVar5 = operator[](in_RDI,local_58);
              *puVar5 = uVar7;
            }
            local_58 = local_58 - 1;
          }
        }
        while (local_40 < local_58) {
          operator[](in_RDI,local_40 + 1);
          CVar3 = ClosureComparator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/Ordering.cpp:963:7)>
                  ::compare<unsigned_int>
                            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                             in_stack_ffffffffffffff48);
          if (CVar3 == LESS) {
            puVar5 = operator[](in_RDI,local_58);
            uVar7 = *puVar5;
            puVar5 = operator[](in_RDI,local_40 + 1);
            uVar8 = *puVar5;
            puVar5 = operator[](in_RDI,local_58);
            *puVar5 = uVar8;
            puVar5 = operator[](in_RDI,local_40 + 1);
            *puVar5 = uVar7;
            local_58 = local_58 - 1;
          }
          else if ((uint)CVar3 < 2) {
            puVar5 = operator[](in_RDI,local_40 + 1);
            uVar7 = *puVar5;
            puVar5 = operator[](in_RDI,local_40);
            *puVar5 = uVar7;
            uVar7 = uVar1;
            puVar5 = operator[](in_RDI,local_40 + 1);
            *puVar5 = uVar7;
            local_40 = local_40 + 1;
          }
        }
        if (local_40 + 1 < local_30) {
          in_stack_ffffffffffffff50 =
               (ClosureComparator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_Ordering_cpp:963:7)>
                *)(local_40 + 1);
          sVar4 = local_38 + 1;
          puVar6 = DArray<unsigned_long>::operator[]
                             (&sortGen<false,_Lib::ClosureComparator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/Ordering.cpp:963:7)>_>
                               ::ft,local_38);
          *puVar6 = (unsigned_long)in_stack_ffffffffffffff50;
          local_38 = local_38 + 2;
          puVar6 = DArray<unsigned_long>::operator[]
                             (&sortGen<false,_Lib::ClosureComparator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/Ordering.cpp:963:7)>_>
                               ::ft,sVar4);
          *puVar6 = local_30;
        }
        local_30 = local_40 - 1;
      } while ((local_40 != 0) && (local_28 < local_30));
      if (local_38 == 0) break;
      puVar6 = DArray<unsigned_long>::operator[]
                         (&sortGen<false,_Lib::ClosureComparator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/Ordering.cpp:963:7)>_>
                           ::ft,local_38 - 2);
      local_28 = *puVar6;
      puVar6 = DArray<unsigned_long>::operator[]
                         (&sortGen<false,_Lib::ClosureComparator<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/Ordering.cpp:963:7)>_>
                           ::ft,local_38 - 1);
      local_30 = *puVar6;
      local_38 = local_38 - 2;
    }
  }
  return;
}

Assistant:

void sortGen(Comparator comp)
  {
    if(_size <= 1) {
      return;
    }

    // array behaves as a stack of calls to quicksort
    static DArray<size_t> ft(32);

    size_t from = 0;
    size_t to=size()-1;
    ft.ensure(to);

    size_t p = 0; // pointer to the next element in ft
    for (;;) {
      ASS(from<size() && to<size()); //checking for underflows
      ASS(from<to);
      // invariant: from < to
      size_t m = from + Random::getInteger(to-from+1);
      C mid = (*this)[m];
      size_t l = from;
      size_t r = to;
      while (l < m) {
        switch ((Inversed?-1:1)*comp.compare((*this)[l],mid))
  	{
  	case EQUAL:
  	case LESS:
  	  l++;
  	  break;
  	case GREATER:
  	  if (m == r) {
  	    (*this)[m] = (*this)[l];
  	    (*this)[l] = (*this)[m-1];
  	    (*this)[m-1] = mid;
  	    m--;
  	    r--;
  	  }
  	  else {
  	    ASS(m < r);
  	    C aux = (*this)[l];
  	    (*this)[l] = (*this)[r];
  	    (*this)[r] = aux;
  	    r--;
  	  }
  	  break;
  	}
      }
      // l == m
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and literals in lits[r+1 ... to] are greater than lits[m]
      while (m < r) {
        switch ((Inversed?-1:1)*comp.compare(mid,(*this)[m+1]))
  	{
  	case LESS:
  	  {
  	    C aux = (*this)[r];
  	    (*this)[r] = (*this)[m+1];
  	    (*this)[m+1] = aux;
  	    r--;
  	  }
  	  break;
  	case EQUAL:
  	case GREATER:
  	  (*this)[m] = (*this)[m+1];
  	  (*this)[m+1] = mid;
  	  m++;
  	}
      }
      // now literals in lits[from ... m-1] are smaller than lits[m]
      // and all literals in lits[m+1 ... to] are greater than lits[m]
      if (m+1 < to) {
        ft[p++] = m+1;
        ft[p++] = to;
      }

      to = m-1;
      if (m!=0 && from < to) {
        continue;
      }
      if (p != 0) {
        p -= 2;
        ASS(p >= 0);
        from = ft[p];
        to = ft[p+1];
        continue;
      }
      return;
    }
  }